

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageErrorsTest::Test2D(StorageErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar11;
  long lVar10;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar9);
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar10 + 0x1450))(pEVar11,1,0x8229,8,8);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x502,"glTextureStorage2D",
                     "texture is not the name of an existing texture object.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar10 + 0x1450))(pEVar11,1,this->m_internalformat_invalid,8,8);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x500,"glTextureStorage2D",
                     "internalformat is not a valid sized internal format.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_1D;
  (**(code **)(lVar10 + 0x1450))(pEVar11,1,0x8229,8,8);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x500,"glTextureStorage2D",
                     "the effective target of texture is not one of the accepted targets.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar10 + 0x1450))(pEVar11,0,0x8229,8,8);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x501,"glTextureStorage2D",
                     "levels is less than 1.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar10 + 0x1450))(pEVar11,1,0x8229,0,8);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x501,"glTextureStorage2D",
                     "width is less than 1.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar10 + 0x1450))(pEVar11,1,0x8229,8,0);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x501,"glTextureStorage2D",
                     "height is less than 1.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_1D_array;
  (**(code **)(lVar10 + 0x1450))(pEVar11,8,0x8229,8,8);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x502,"glTextureStorage2D",
                     "target is TEXTURE_1D_ARRAY and levels is greater than log2(width)+1.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar10 + 0x1450))(pEVar11,8,0x8229,8,8);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x502,"glTextureStorage2D",
                     "target is TEXTURE_2D and levels is greater than log2(max(width, height))+1.");
  return bVar8 && ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool StorageErrorsTest::Test2D()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	/*  Check that INVALID_OPERATION is generated by TextureStorage2D if
	 texture is not the name of an existing texture object. */
	{
		gl.textureStorage2D(m_to_invalid, 1, GL_R8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage2D",
								  "texture is not the name of an existing texture object.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage2D if
	 internalformat is not a valid sized internal format. */
	{
		gl.textureStorage2D(m_to_2D, 1, m_internalformat_invalid, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage2D",
								  "internalformat is not a valid sized internal format.");
	}

	/*  Check that INVALID_ENUM is generated by TextureStorage2D if target or
	 the effective target of texture is not one of the accepted targets
	 described above. */
	{
		gl.textureStorage2D(m_to_1D, 1, GL_R8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureStorage2D",
								  "the effective target of texture is not one of the accepted targets.");
	}

	/*  Check that INVALID_VALUE is generated by TextureStorage2D if width,
	 height or levels are less than 1. */
	{
		gl.textureStorage2D(m_to_2D, 0, GL_R8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2D", "levels is less than 1.");

		gl.textureStorage2D(m_to_2D, 1, GL_R8, 0, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2D", "width is less than 1.");

		gl.textureStorage2D(m_to_2D, 1, GL_R8, 8, 0);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_VALUE, "glTextureStorage2D", "height is less than 1.");
	}

	/* Check that INVALID_OPERATION is generated by TextureStorage2D if target
	 is TEXTURE_1D_ARRAY or PROXY_TEXTURE_1D_ARRAY and levels is greater than
	 log2(width)+1. */
	{
		gl.textureStorage2D(m_to_1D_array, 8, GL_R8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage2D",
								  "target is TEXTURE_1D_ARRAY and levels is greater than log2(width)+1.");
	}

	/*  Check that INVALID_OPERATION is generated by TextureStorage2D if target
	 is not TEXTURE_1D_ARRAY or PROXY_TEXTURE_1D_ARRAY and levels is greater
	 than log2(max(width, height))+1.  */
	{
		gl.textureStorage2D(m_to_2D, 8, GL_R8, 8, 8);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureStorage2D",
								  "target is TEXTURE_2D and levels is greater than log2(max(width, height))+1.");
	}

	return is_ok;
}